

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# practise3.7.cpp
# Opt level: O2

int enQueue(CycQueue *Q,int x)

{
  bool bVar1;
  
  bVar1 = Q->rear != (Q->front + 99) % 100;
  if (bVar1) {
    Q->data[Q->front] = x;
    Q->front = (Q->front + 99) % 100;
  }
  return (uint)bVar1;
}

Assistant:

int enQueue(CycQueue &Q, int x) {
    if(Q.rear == (Q.front-1+maxSize)%maxSize) //队满
        return 0;
    else {
        Q.data[Q.front] = x;  //x入队首
        Q.front = (Q.front-1+maxSize)%maxSize; //修改队首指针
        return 1;
    }
}